

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_io.c
# Opt level: O1

int CVodeSetMaxHnilWarns(void *cvode_mem,int mxhnil)

{
  int iVar1;
  
  if (cvode_mem == (void *)0x0) {
    iVar1 = -0x15;
    cvProcessError((CVodeMem)0x0,-0x15,0xe7,"CVodeSetMaxHnilWarns",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes_io.c"
                   ,"cvode_mem = NULL illegal.");
  }
  else {
    *(int *)((long)cvode_mem + 0x5a8) = mxhnil;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int CVodeSetMaxHnilWarns(void* cvode_mem, int mxhnil)
{
  CVodeMem cv_mem;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem)cvode_mem;

  cv_mem->cv_mxhnil = mxhnil;

  return (CV_SUCCESS);
}